

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O2

void absl::lts_20250127::internal_any_invocable::
     LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
               (TypeErasedState *state,ForwardedParameterType<google::protobuf::io::Printer_*> args)

{
  void *pvVar1;
  Options *in_RCX;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  Sub local_d0;
  
  pvVar1 = (state->remote).target;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"pin",&local_111);
  google::protobuf::compiler::cpp::StrongReferenceToType_abi_cxx11_
            (&local_110,(cpp *)(state->remote).size,(Descriptor *)((long)pvVar1 + 0x58),in_RCX);
  google::protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_d0,&local_f0,&local_110);
  google::protobuf::io::Printer::Emit
            (args,&local_d0,1,0x2e,"\n                    $pin$,\n                  ");
  google::protobuf::io::Printer::Sub::~Sub(&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

ReturnType LocalInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(
      IsStoredLocally<RawT>::value,
      "Target object must be in local storage in order to be invoked from it.");

  auto& f = (ObjectInLocalStorage<RawT>)(state);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}